

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void cleanup_hints(void)

{
  hint *phVar1;
  hint *p;
  
  p = hints;
  if (hints != (hint *)0x0) {
    do {
      phVar1 = p->next;
      string_free(p->hint);
      mem_free(p);
      p = phVar1;
    } while (phVar1 != (hint *)0x0);
  }
  return;
}

Assistant:

static void cleanup_hints(void)
{
	struct hint *h, *next;

	h = hints;
	while(h) {
		next = h->next;
		string_free(h->hint);
		mem_free(h);
		h = next;
	}
}